

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ddcf::TwoValuesWithHashCollision::SetUp(TwoValuesWithHashCollision *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TwoValuesWithHashCollision *local_10;
  TwoValuesWithHashCollision *this_local;
  
  local_10 = this;
  testing::Test::SetUp((Test *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"a",&local_31);
  uVar1 = hash_function::operator()(&this->hash_,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"b",&local_69);
  uVar2 = hash_function::operator()(&this->hash_,&local_68);
  check_collision(this,uVar1,uVar2,1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"a",&local_91);
  uVar1 = hash_function::operator()(&this->hash_,&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"c",&local_b9);
  uVar2 = hash_function::operator()(&this->hash_,&local_b8);
  check_collision(this,uVar1,uVar2,1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"e",&local_e1);
  uVar1 = hash_function::operator()(&this->hash_,&local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"f",&local_109);
  uVar2 = hash_function::operator()(&this->hash_,&local_108);
  check_collision(this,uVar1,uVar2,10);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

void SetUp () final {
            GenericIndexFixture::SetUp ();
            this->check_collision (hash_ ("a"), hash_ ("b"), 1);
            this->check_collision (hash_ ("a"), hash_ ("c"), 1);
            this->check_collision (hash_ ("e"), hash_ ("f"), 10);
        }